

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPIChain.cpp
# Opt level: O1

void __thiscall adios2::aggregator::MPIChain::HandshakeLinks(MPIChain *this)

{
  int *count;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  Req sendRequest;
  Req receiveRequest;
  int link;
  Req local_78;
  Comm local_70;
  undefined4 local_64;
  string local_60;
  Status local_40;
  
  local_64 = 0xffffffff;
  helper::Comm::Req::Req(&local_78);
  count = &(this->super_MPIAggregator).m_Rank;
  iVar2 = (this->super_MPIAggregator).m_Rank;
  paVar1 = &local_60.field_2;
  if (0 < iVar2) {
    local_60._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"Isend handshake with neighbor, MPIChain aggregator, at Open","")
    ;
    helper::Comm::Isend<int>
              ((Comm *)&local_40,(int *)&(this->super_MPIAggregator).m_Comm,(size_t)count,1,
               iVar2 + -1,(string *)0x0);
    helper::Comm::Req::operator=(&local_78,(Req *)&local_40);
    helper::Comm::Req::~Req((Req *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p);
    }
  }
  iVar2 = (this->super_MPIAggregator).m_Rank;
  if (iVar2 < (this->super_MPIAggregator).m_Size + -1) {
    local_60._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"Irecv handshake with neighbor, MPIChain aggregator, at Open","")
    ;
    helper::Comm::Irecv<int>
              (&local_70,(int *)&(this->super_MPIAggregator).m_Comm,(size_t)&local_64,1,iVar2 + 1,
               (string *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    local_60._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,
               "Irecv Wait handshake with neighbor, MPIChain aggregator, at Open","");
    helper::Comm::Req::Wait(&local_40,(Req *)&local_70,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    helper::Comm::Req::~Req((Req *)&local_70);
  }
  if (0 < *count) {
    local_60._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,
               "Isend wait handshake with neighbor, MPIChain aggregator, at Open","");
    helper::Comm::Req::Wait(&local_40,&local_78,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p);
    }
  }
  helper::Comm::Req::~Req(&local_78);
  return;
}

Assistant:

void MPIChain::HandshakeLinks()
{
    int link = -1;

    helper::Comm::Req sendRequest;
    if (m_Rank > 0) // send
    {
        sendRequest = m_Comm.Isend(&m_Rank, 1, m_Rank - 1, 0,
                                   "Isend handshake with neighbor, MPIChain aggregator, at Open");
    }

    if (m_Rank < m_Size - 1) // receive
    {
        helper::Comm::Req receiveRequest = m_Comm.Irecv(
            &link, 1, m_Rank + 1, 0, "Irecv handshake with neighbor, MPIChain aggregator, at Open");

        receiveRequest.Wait("Irecv Wait handshake with neighbor, MPIChain aggregator, at Open");
    }

    if (m_Rank > 0)
    {
        sendRequest.Wait("Isend wait handshake with neighbor, MPIChain aggregator, at Open");
    }
}